

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsSetDownloadCounter(Curl_easy *data,curl_off_t size)

{
  long lVar1;
  timeval now_00;
  __time_t local_28;
  timeval now;
  curl_off_t size_local;
  Curl_easy *data_local;
  
  now_00 = curlx_tvnow();
  (data->progress).downloaded = size;
  if (0 < (data->set).max_recv_speed) {
    local_28 = now_00.tv_sec;
    now.tv_sec = now_00.tv_usec;
    lVar1 = Curl_pgrsLimitWaitTime
                      ((data->progress).downloaded,(data->progress).dl_limit_size,
                       (data->set).max_recv_speed,(data->progress).dl_limit_start,now_00);
    if (lVar1 == 0) {
      (data->progress).dl_limit_start.tv_sec = local_28;
      (data->progress).dl_limit_start.tv_usec = now.tv_sec;
      (data->progress).dl_limit_size = size;
    }
  }
  return;
}

Assistant:

void Curl_pgrsSetDownloadCounter(struct Curl_easy *data, curl_off_t size)
{
  struct timeval now = Curl_tvnow();

  data->progress.downloaded = size;

  /* download speed limit */
  if((data->set.max_recv_speed > 0) &&
     (Curl_pgrsLimitWaitTime(data->progress.downloaded,
                             data->progress.dl_limit_size,
                             data->set.max_recv_speed,
                             data->progress.dl_limit_start,
                             now) == 0)) {
    data->progress.dl_limit_start = now;
    data->progress.dl_limit_size = size;
  }
}